

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O3

int parse_bag_attributes(CBS *attrs,uint8_t **out_friendly_name,size_t *out_friendly_name_len)

{
  int iVar1;
  uint32_t c;
  CBS value;
  CBS values;
  CBS oid;
  CBS attr;
  CBB cbb;
  uint32_t local_ac;
  size_t *local_a8;
  CBS local_a0;
  CBS local_90;
  CBS local_80;
  CBS local_70;
  CBB local_60;
  
  *out_friendly_name = (uint8_t *)0x0;
  *out_friendly_name_len = 0;
  if (attrs->len != 0) {
    local_a8 = out_friendly_name_len;
    do {
      iVar1 = CBS_get_asn1(attrs,&local_70,0x20000010);
      if ((((iVar1 == 0) || (iVar1 = CBS_get_asn1(&local_70,&local_80,6), iVar1 == 0)) ||
          (iVar1 = CBS_get_asn1(&local_70,&local_90,0x20000011), iVar1 == 0)) || (local_70.len != 0)
         ) {
        iVar1 = 0x118;
LAB_00196d21:
        ERR_put_error(0x13,0,100,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                      ,iVar1);
LAB_00196d26:
        OPENSSL_free(*out_friendly_name);
        *out_friendly_name = (uint8_t *)0x0;
        *local_a8 = 0;
        return 0;
      }
      iVar1 = CBS_mem_equal(&local_80,kFriendlyName,9);
      if (iVar1 != 0) {
        if (((*out_friendly_name != (uint8_t *)0x0) ||
            (iVar1 = CBS_get_asn1(&local_90,&local_a0,0x1e), iVar1 == 0)) ||
           ((local_90.len != 0 || (local_a0.len == 0)))) {
          iVar1 = 0x121;
          goto LAB_00196d21;
        }
        iVar1 = CBB_init(&local_60,local_a0.len);
        if (iVar1 == 0) goto LAB_00196d26;
        while (local_a0.len != 0) {
          iVar1 = CBS_get_ucs2_be(&local_a0,&local_ac);
          if ((iVar1 == 0) || (iVar1 = CBB_add_utf8(&local_60,local_ac), iVar1 == 0)) {
            ERR_put_error(0x13,0,0x83,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                          ,300);
            goto LAB_00196ce1;
          }
        }
        iVar1 = CBB_finish(&local_60,out_friendly_name,local_a8);
        if (iVar1 == 0) {
LAB_00196ce1:
          CBB_cleanup(&local_60);
          goto LAB_00196d26;
        }
      }
    } while (attrs->len != 0);
  }
  return 1;
}

Assistant:

static int parse_bag_attributes(CBS *attrs, uint8_t **out_friendly_name,
                                size_t *out_friendly_name_len) {
  *out_friendly_name = NULL;
  *out_friendly_name_len = 0;

  // See https://tools.ietf.org/html/rfc7292#section-4.2.
  while (CBS_len(attrs) != 0) {
    CBS attr, oid, values;
    if (!CBS_get_asn1(attrs, &attr, CBS_ASN1_SEQUENCE) ||
        !CBS_get_asn1(&attr, &oid, CBS_ASN1_OBJECT) ||
        !CBS_get_asn1(&attr, &values, CBS_ASN1_SET) || CBS_len(&attr) != 0) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
      goto err;
    }
    if (CBS_mem_equal(&oid, kFriendlyName, sizeof(kFriendlyName))) {
      // See https://tools.ietf.org/html/rfc2985, section 5.5.1.
      CBS value;
      if (*out_friendly_name != NULL ||
          !CBS_get_asn1(&values, &value, CBS_ASN1_BMPSTRING) ||
          CBS_len(&values) != 0 || CBS_len(&value) == 0) {
        OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_PKCS12_DATA);
        goto err;
      }
      // Convert the friendly name to UTF-8.
      CBB cbb;
      if (!CBB_init(&cbb, CBS_len(&value))) {
        goto err;
      }
      while (CBS_len(&value) != 0) {
        uint32_t c;
        if (!CBS_get_ucs2_be(&value, &c) || !CBB_add_utf8(&cbb, c)) {
          OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_INVALID_CHARACTERS);
          CBB_cleanup(&cbb);
          goto err;
        }
      }
      if (!CBB_finish(&cbb, out_friendly_name, out_friendly_name_len)) {
        CBB_cleanup(&cbb);
        goto err;
      }
    }
  }

  return 1;

err:
  OPENSSL_free(*out_friendly_name);
  *out_friendly_name = NULL;
  *out_friendly_name_len = 0;
  return 0;
}